

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUnixMutex_Unlock(PaUnixMutex *self)

{
  int iVar1;
  pthread_t __thread1;
  long errorCode;
  char *errorText;
  PaError local_14;
  PaError result;
  PaUnixMutex *self_local;
  
  local_14 = 0;
  paUtilErr_ = pthread_mutex_unlock((pthread_mutex_t *)self);
  if (paUtilErr_ != 0) {
    __thread1 = pthread_self();
    iVar1 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar1 != 0) {
      errorCode = (long)paUtilErr_;
      errorText = strerror(paUtilErr_);
      PaUtil_SetLastHostErrorInfo(paALSA,errorCode,errorText);
    }
    PaUtil_DebugPrint(
                     "Expression \'pthread_mutex_unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 541\n"
                     );
    local_14 = -9999;
  }
  return local_14;
}

Assistant:

PaError PaUnixMutex_Unlock( PaUnixMutex* self )
{
    PaError result = paNoError;

    PA_ENSURE_SYSTEM( pthread_mutex_unlock( &self->mtx ), 0 );
#ifdef PTHREAD_CANCEL
    int oldState;
    PA_ENSURE_SYSTEM( pthread_setcancelstate( PTHREAD_CANCEL_ENABLE, &oldState ), 0 );
#endif

error:
    return result;
}